

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvQuadSensEwtSet(CVodeMem cv_mem,N_Vector *yQScur,N_Vector *weightQS)

{
  int iVar1;
  CVodeMem in_RDX;
  N_Vector *in_RSI;
  CVodeMem in_RDI;
  int flag;
  N_Vector *in_stack_ffffffffffffffd8;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = in_RDI->cv_itolQS;
  if (iVar1 == 1) {
    iVar2 = cvQuadSensEwtSetSS(in_RDX,(N_Vector *)0x1,in_stack_ffffffffffffffd8);
  }
  else if (iVar1 == 2) {
    iVar2 = cvQuadSensEwtSetSV(in_RDX,(N_Vector *)0x2,in_stack_ffffffffffffffd8);
  }
  else if (iVar1 == 4) {
    iVar2 = cvQuadSensEwtSetEE(in_RDI,in_RSI,(N_Vector *)in_RDX);
  }
  return iVar2;
}

Assistant:

static int cvQuadSensEwtSet(CVodeMem cv_mem, N_Vector* yQScur, N_Vector* weightQS)
{
  int flag = 0;

  switch (cv_mem->cv_itolQS)
  {
  case CV_EE: flag = cvQuadSensEwtSetEE(cv_mem, yQScur, weightQS); break;
  case CV_SS: flag = cvQuadSensEwtSetSS(cv_mem, yQScur, weightQS); break;
  case CV_SV: flag = cvQuadSensEwtSetSV(cv_mem, yQScur, weightQS); break;
  }

  return (flag);
}